

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerServer.cpp
# Opt level: O0

void __thiscall helics::apps::BrokerServer::startServers(BrokerServer *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  reference pvVar5;
  reference psVar6;
  pointer this_00;
  json *pjVar7;
  byte *in_RDI;
  shared_ptr<helics::apps::TypedBrokerServer> *server;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  *__range2;
  size_type fc_1;
  size_type fc;
  shared_ptr<helics::apps::WebServer> webs;
  shared_ptr<helics::apps::AsioBrokerServer> asios;
  shared_ptr<helics::apps::zmqBrokerServer> zmqs;
  vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  size_type in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  __normal_iterator<std::shared_ptr<helics::apps::TypedBrokerServer>_*,_std::vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>_>
  local_118;
  byte *local_110;
  __sv_type local_f8;
  size_type local_e8;
  __sv_type local_e0;
  size_type local_d0;
  __sv_type local_a8;
  __sv_type local_98;
  __sv_type local_68;
  
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e7d38);
  if (bVar1) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::
    make_unique<helics::fileops::JsonStorage,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)in_stack_fffffffffffffe68);
    CLI::std::
    unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>::
    operator=((unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
               *)in_stack_fffffffffffffe50,
              (unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
               *)in_stack_fffffffffffffe48);
    CLI::std::
    unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>::
    ~unique_ptr((unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
                 *)in_stack_fffffffffffffe50);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffe50);
  }
  else {
    fileops::loadJson((string *)fc);
    std::
    make_unique<helics::fileops::JsonStorage,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)in_stack_fffffffffffffe68);
    CLI::std::
    unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>::
    operator=((unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
               *)in_stack_fffffffffffffe50,
              (unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
               *)in_stack_fffffffffffffe48);
    CLI::std::
    unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>::
    ~unique_ptr((unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
                 *)in_stack_fffffffffffffe50);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffe50);
  }
  if (((*in_RDI & 1) != 0) || ((in_RDI[1] & 1) != 0)) {
    std::make_shared<helics::apps::zmqBrokerServer,std::__cxx11::string&>(in_stack_fffffffffffffe78)
    ;
    if ((*in_RDI & 1) != 0) {
      peVar2 = CLI::std::
               __shared_ptr_access<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e7ead);
      zmqBrokerServer::enableZmqServer(peVar2,true);
    }
    if ((in_RDI[1] & 1) != 0) {
      peVar2 = CLI::std::
               __shared_ptr_access<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e7ef2);
      zmqBrokerServer::enableZmqSsServer(peVar2,true);
    }
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e7f17);
    if (!bVar1) {
      peVar2 = CLI::std::
               __shared_ptr_access<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e7f28);
      local_68 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe50)
      ;
      (*(peVar2->super_TypedBrokerServer)._vptr_TypedBrokerServer[4])
                (peVar2,local_68._M_len,local_68._M_str);
    }
    std::shared_ptr<helics::apps::TypedBrokerServer>::shared_ptr<helics::apps::zmqBrokerServer,void>
              ((shared_ptr<helics::apps::TypedBrokerServer> *)in_stack_fffffffffffffe50,
               (shared_ptr<helics::apps::zmqBrokerServer> *)in_stack_fffffffffffffe48);
    CLI::std::
    vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
    ::push_back((vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
                 *)in_stack_fffffffffffffe50,(value_type *)in_stack_fffffffffffffe48);
    CLI::std::shared_ptr<helics::apps::TypedBrokerServer>::~shared_ptr
              ((shared_ptr<helics::apps::TypedBrokerServer> *)0x1e7fbc);
    CLI::std::shared_ptr<helics::apps::zmqBrokerServer>::~shared_ptr
              ((shared_ptr<helics::apps::zmqBrokerServer> *)0x1e7fc9);
  }
  if (((in_RDI[2] & 1) != 0) || ((in_RDI[3] & 1) != 0)) {
    std::make_shared<helics::apps::AsioBrokerServer,std::__cxx11::string&>
              (in_stack_fffffffffffffe78);
    if ((in_RDI[2] & 1) != 0) {
      peVar3 = CLI::std::
               __shared_ptr_access<helics::apps::AsioBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::apps::AsioBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e8056);
      AsioBrokerServer::enableTcpServer(peVar3,true);
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e8079);
      if (!bVar1) {
        peVar3 = CLI::std::
                 __shared_ptr_access<helics::apps::AsioBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<helics::apps::AsioBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e808a);
        local_98 = std::__cxx11::string::operator_cast_to_basic_string_view
                             (in_stack_fffffffffffffe50);
        (*(peVar3->super_TypedBrokerServer)._vptr_TypedBrokerServer[4])
                  (peVar3,local_98._M_len,local_98._M_str);
      }
    }
    if ((in_RDI[3] & 1) != 0) {
      peVar3 = CLI::std::
               __shared_ptr_access<helics::apps::AsioBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::apps::AsioBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e810f);
      AsioBrokerServer::enableUdpServer(peVar3,true);
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e8132);
      if (!bVar1) {
        peVar3 = CLI::std::
                 __shared_ptr_access<helics::apps::AsioBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<helics::apps::AsioBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e8143);
        local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                             (in_stack_fffffffffffffe50);
        (*(peVar3->super_TypedBrokerServer)._vptr_TypedBrokerServer[4])
                  (peVar3,local_a8._M_len,local_a8._M_str);
      }
    }
    std::shared_ptr<helics::apps::TypedBrokerServer>::
    shared_ptr<helics::apps::AsioBrokerServer,void>
              ((shared_ptr<helics::apps::TypedBrokerServer> *)in_stack_fffffffffffffe50,
               (shared_ptr<helics::apps::AsioBrokerServer> *)in_stack_fffffffffffffe48);
    CLI::std::
    vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
    ::push_back((vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
                 *)in_stack_fffffffffffffe50,(value_type *)in_stack_fffffffffffffe48);
    CLI::std::shared_ptr<helics::apps::TypedBrokerServer>::~shared_ptr
              ((shared_ptr<helics::apps::TypedBrokerServer> *)0x1e81d9);
    CLI::std::shared_ptr<helics::apps::AsioBrokerServer>::~shared_ptr
              ((shared_ptr<helics::apps::AsioBrokerServer> *)0x1e81e6);
  }
  if (((in_RDI[4] & 1) != 0) || ((in_RDI[5] & 1) != 0)) {
    std::make_shared<helics::apps::WebServer,std::__cxx11::string&>(in_stack_fffffffffffffe78);
    if ((in_RDI[4] & 1) != 0) {
      peVar4 = CLI::std::
               __shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e8273);
      WebServer::enableHttpServer(peVar4,true);
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e8293);
      if (!bVar1) {
        local_d0 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find_first_not_of(in_stack_fffffffffffffe68,
                                     (char)((ulong)in_stack_fffffffffffffe60 >> 0x38),
                                     in_stack_fffffffffffffe58);
        if ((local_d0 != 0xffffffffffffffff) &&
           (pvVar5 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               (in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48),
           *pvVar5 == '-')) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (char *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
        }
        peVar4 = CLI::std::
                 __shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e8342);
        local_e0 = std::__cxx11::string::operator_cast_to_basic_string_view
                             (in_stack_fffffffffffffe50);
        (*(peVar4->super_TypedBrokerServer)._vptr_TypedBrokerServer[4])
                  (peVar4,local_e0._M_len,local_e0._M_str);
      }
    }
    if ((in_RDI[5] & 1) != 0) {
      peVar4 = CLI::std::
               __shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e83ab);
      WebServer::enableWebSocketServer(peVar4,true);
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e83ce);
      if (!bVar1) {
        local_e8 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find_first_not_of(in_stack_fffffffffffffe68,
                                     (char)((ulong)in_stack_fffffffffffffe60 >> 0x38),
                                     in_stack_fffffffffffffe58);
        if ((local_e8 != 0xffffffffffffffff) &&
           (pvVar5 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               (in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48),
           *pvVar5 == '-')) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (char *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
        }
        peVar4 = CLI::std::
                 __shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e846d);
        local_f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                             (in_stack_fffffffffffffe50);
        (*(peVar4->super_TypedBrokerServer)._vptr_TypedBrokerServer[4])
                  (peVar4,local_f8._M_len,local_f8._M_str);
      }
    }
    std::shared_ptr<helics::apps::TypedBrokerServer>::shared_ptr<helics::apps::WebServer,void>
              ((shared_ptr<helics::apps::TypedBrokerServer> *)in_stack_fffffffffffffe50,
               (shared_ptr<helics::apps::WebServer> *)in_stack_fffffffffffffe48);
    CLI::std::
    vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
    ::push_back((vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
                 *)in_stack_fffffffffffffe50,(value_type *)in_stack_fffffffffffffe48);
    CLI::std::shared_ptr<helics::apps::TypedBrokerServer>::~shared_ptr
              ((shared_ptr<helics::apps::TypedBrokerServer> *)0x1e8503);
    CLI::std::shared_ptr<helics::apps::WebServer>::~shared_ptr
              ((shared_ptr<helics::apps::WebServer> *)0x1e8510);
  }
  local_110 = in_RDI + 8;
  local_118._M_current =
       (shared_ptr<helics::apps::TypedBrokerServer> *)
       CLI::std::
       vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
       ::begin(in_stack_fffffffffffffe48);
  CLI::std::
  vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ::end(in_stack_fffffffffffffe48);
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<helics::apps::TypedBrokerServer>_*,_std::vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>_>
                           ((__normal_iterator<std::shared_ptr<helics::apps::TypedBrokerServer>_*,_std::vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>_>
                             *)in_stack_fffffffffffffe50,
                            (__normal_iterator<std::shared_ptr<helics::apps::TypedBrokerServer>_*,_std::vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>_>
                             *)in_stack_fffffffffffffe48), ((bVar1 ^ 0xffU) & 1) != 0) {
    psVar6 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<helics::apps::TypedBrokerServer>_*,_std::vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>_>
             ::operator*(&local_118);
    in_stack_fffffffffffffe50 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::
         __shared_ptr_access<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1e85c2);
    this_00 = CLI::std::
              unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
              ::operator->((unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
                            *)0x1e85d8);
    pjVar7 = fileops::JsonStorage::json_abi_cxx11_(this_00);
    (*(*(_func_int ***)&in_stack_fffffffffffffe50->_M_dataplus)[2])
              (in_stack_fffffffffffffe50,pjVar7,psVar6);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<helics::apps::TypedBrokerServer>_*,_std::vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>_>
    ::operator++(&local_118);
  }
  return;
}

Assistant:

void BrokerServer::startServers()
{
    if (!configFile_.empty()) {
        config_ = std::make_unique<fileops::JsonStorage>(fileops::loadJson(configFile_));
    } else {
        config_ = std::make_unique<fileops::JsonStorage>(nlohmann::json());
    }
    if (zmq_server || zmq_ss_server) {
        auto zmqs = std::make_shared<zmqBrokerServer>(server_name_);
        if (zmq_server) {
            zmqs->enableZmqServer(true);
        }
        if (zmq_ss_server) {
            zmqs->enableZmqSsServer(true);
        }
        if (!mZmqArgs.empty()) {
            zmqs->processArgs(mZmqArgs);
        }
        servers.push_back(std::move(zmqs));
    }
    if (tcp_server || udp_server) {
        auto asios = std::make_shared<AsioBrokerServer>(server_name_);
        if (tcp_server) {
            asios->enableTcpServer(true);
            if (!mTcpArgs.empty()) {
                asios->processArgs(mTcpArgs);
            }
        }
        if (udp_server) {
            asios->enableUdpServer(true);
            if (!mUdpArgs.empty()) {
                asios->processArgs(mUdpArgs);
            }
        }
        servers.push_back(std::move(asios));
    }

    if (http_server || websocket_server) {
#ifdef HELICS_ENABLE_WEBSERVER
        auto webs = std::make_shared<WebServer>(server_name_);
        if (http_server) {
            webs->enableHttpServer(true);
            if (!mHttpArgs.empty()) {
                auto fc = mHttpArgs.find_first_not_of(' ');
                if (fc != std::string::npos) {
                    if (mHttpArgs[fc] == '-') {
                        mHttpArgs.insert(0, "http ", 5);
                    }
                }

                webs->processArgs(mHttpArgs);
            }
        }
        if (websocket_server) {
            webs->enableWebSocketServer(true);
            if (!mWebSocketArgs.empty()) {
                auto fc = mWebSocketArgs.find_first_not_of(' ');
                if (fc != std::string::npos) {
                    if (mWebSocketArgs[fc] == '-') {
                        mWebSocketArgs.insert(0, "websocket ", 10);
                    }
                }
                webs->processArgs(mWebSocketArgs);
            }
        }
        servers.push_back(std::move(webs));
#else
        std::cout << "Webserver not enabled" << std::endl;
#endif
    }
    for (auto& server : servers) {
        server->startServer(&config_->json(), server);
    }
}